

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::convertTextData<unsigned_short>
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,unsigned_short *source,
          char *pointerToStore,int sizeWithoutHeader)

{
  byte bVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  
  bVar1 = 0x2bU >> ((byte)this->TargetFormat & 0x1f) &
          this->TargetFormat < (ETF_UTF32_BE|ETF_UTF16_BE);
  if ((this->SourceFormat < (ETF_UTF32_BE|ETF_UTF16_BE)) &&
     ((0x2bU >> (this->SourceFormat & 0x1f) & 1) != 0)) {
    if (bVar1 != 0) goto LAB_005b207b;
  }
  else if (bVar1 == 0) goto LAB_005b207b;
  convertToLittleEndian<unsigned_short>(this,source);
LAB_005b207b:
  uVar3 = 0xffffffffffffffff;
  if (-1 < sizeWithoutHeader) {
    uVar3 = (ulong)(uint)sizeWithoutHeader << 3;
  }
  puVar2 = (unsigned_long *)operator_new__(uVar3);
  this->TextData = puVar2;
  __assert_fail("numShift < 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/irrXML/CXMLReaderImpl.h"
                ,0x2a9,
                "void irr::io::CXMLReaderImpl<unsigned long, irr::io::IXMLBase>::convertTextData(src_char_type *, char *, int) [char_type = unsigned long, superclass = irr::io::IXMLBase, src_char_type = unsigned short]"
               );
}

Assistant:

void convertTextData(src_char_type* source, char* pointerToStore, int sizeWithoutHeader)
	{
		// convert little to big endian if necessary
		if (sizeof(src_char_type) > 1 && 
			isLittleEndian(TargetFormat) != isLittleEndian(SourceFormat))
			convertToLittleEndian(source);

		// check if conversion is necessary:
		if (sizeof(src_char_type) == sizeof(char_type))
		{
			// no need to convert
			TextBegin = (char_type*)source;
			TextData = (char_type*)pointerToStore;
			TextSize = sizeWithoutHeader;
		}
		else
		{
			// convert source into target data format. 
			// TODO: implement a real conversion. This one just 
			// copies bytes. This is a problem when there are 
			// unicode symbols using more than one character.

			TextData = new char_type[sizeWithoutHeader];

			// MSVC debugger complains here about loss of data ...
			size_t numShift = sizeof( char_type) * 8;
			assert(numShift < 64);
			const src_char_type cc = (src_char_type)(((uint64_t(1u) << numShift) - 1));
			for (int i=0; i<sizeWithoutHeader; ++i)
				TextData[i] = char_type( source[i] & cc); 

			TextBegin = TextData;
			TextSize = sizeWithoutHeader;

			// delete original data because no longer needed
			delete [] pointerToStore;
		}
	}